

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbrz.cpp
# Opt level: O1

void (anonymous_namespace)::ColorGradientRGB::alphaGrad<7u,8u>(uint32_t *pixBack,uint32_t pixFront)

{
  uint uVar1;
  
  uVar1 = *pixBack;
  *pixBack = (((uVar1 >> 0x10 & 0xff) + (pixFront >> 0x10 & 0xff) * 7) * 0x2000 |
             (uVar1 & 0xff) + (pixFront & 0xff) * 7 >> 3) & 0xff00ff |
             ((uVar1 >> 8 & 0xff) + (pixFront >> 8 & 0xff) * 7 & 0x7f8) << 5;
  return;
}

Assistant:

static void alphaGrad(uint32_t& pixBack, uint32_t pixFront)
    {
        pixBack = gradientRGB<M, N>(pixFront, pixBack);
    }